

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall wallet::coinselector_tests::waste_test::test_method(waste_test *this)

{
  bool bVar1;
  undefined1 uVar2;
  lazy_ostream *plVar3;
  SelectionResult *result;
  long in_FS_OFFSET;
  CAmount large_fee_diff;
  CAmount new_target;
  CAmount exact_target;
  CAmount target;
  CAmount in_amt;
  CAmount fee_diff;
  CAmount change_fee;
  CAmount min_viable_change;
  CAmount fee;
  CAmount target_waste2;
  CAmount target_waste1;
  CAmount excess;
  CAmount change_cost;
  SelectionResult selection_6;
  SelectionResult selection_5;
  SelectionResult selection_4;
  SelectionResult selection_3;
  SelectionResult selection_2;
  SelectionResult selection_1;
  SelectionResult selection;
  SelectionResult selection_nochange2;
  SelectionResult selection_nochange1;
  SelectionResult selection3;
  SelectionResult selection2;
  SelectionResult selection1;
  char *in_stack_fffffffffffff1f8;
  lazy_ostream *in_stack_fffffffffffff200;
  char *in_stack_fffffffffffff208;
  undefined7 in_stack_fffffffffffff220;
  undefined1 in_stack_fffffffffffff227;
  _func_int **in_stack_fffffffffffff228;
  lazy_ostream *in_stack_fffffffffffff230;
  unit_test_log_t *in_stack_fffffffffffff238;
  unit_test_log_t *puVar4;
  SelectionResult *in_stack_fffffffffffff240;
  SelectionResult *this_00;
  undefined7 in_stack_fffffffffffff248;
  undefined1 in_stack_fffffffffffff24f;
  SelectionResult *in_stack_fffffffffffff250;
  undefined8 in_stack_fffffffffffff258;
  int iVar5;
  CAmount *in_stack_fffffffffffff260;
  CAmount in_stack_fffffffffffff330;
  undefined1 *fee_00;
  lazy_ostream local_b48;
  undefined1 local_b30 [64];
  undefined8 local_af0;
  undefined8 local_ae8;
  undefined8 local_ae0;
  lazy_ostream local_ad8;
  undefined1 local_ac0 [64];
  undefined8 local_a80;
  undefined8 local_a78;
  undefined8 local_a70;
  lazy_ostream local_a68;
  undefined1 local_a58 [16];
  undefined1 local_a48 [64];
  undefined8 local_a08;
  undefined8 local_a00;
  lazy_ostream local_9f8;
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [64];
  undefined8 local_998;
  undefined8 local_990;
  lazy_ostream local_988;
  undefined1 local_978 [16];
  undefined1 local_968 [64];
  undefined8 local_928;
  undefined8 local_920;
  lazy_ostream local_918;
  undefined1 local_900 [64];
  undefined8 local_8c0;
  undefined8 local_8b8;
  lazy_ostream local_8b0;
  undefined1 local_898 [64];
  undefined8 local_858;
  undefined8 local_850;
  lazy_ostream local_848;
  undefined1 local_838 [16];
  undefined1 local_828 [64];
  lazy_ostream local_7e8;
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [64];
  undefined8 local_788;
  undefined8 local_780;
  lazy_ostream local_778;
  undefined1 local_768 [16];
  undefined1 local_758 [64];
  undefined8 local_718;
  undefined8 local_710;
  lazy_ostream local_708;
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [64];
  lazy_ostream local_6a8;
  undefined1 local_698 [16];
  undefined1 local_688 [64];
  undefined8 local_648;
  undefined8 local_640;
  lazy_ostream local_638;
  undefined1 local_628 [16];
  undefined1 local_618 [64];
  undefined8 local_5d8;
  undefined8 local_5d0;
  lazy_ostream local_5c8;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [64];
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  SelectionResult local_548 [6];
  undefined1 local_2a8 [672];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_550 = 0x7d;
  local_558 = 0x50;
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_560 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_568 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_5c8.m_empty = true;
    local_5c8._9_7_ = 0;
    local_5c8._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection1.GetWaste()";
    in_stack_fffffffffffff200 = &local_5c8;
    in_stack_fffffffffffff1f8 = "fee_diff * 2 + change_cost";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_5a8,local_5b8,0x380,1,2,&local_5c8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_5d0 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_5d8 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_638._8_8_ = SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    local_638._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection1.GetWaste()";
    in_stack_fffffffffffff200 = &local_638;
    in_stack_fffffffffffff1f8 = "selection2.GetWaste()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::gt_impl,long,long>
              (local_618,local_628,0x387,1,6,&local_638.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_640 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_648 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_6a8.m_empty = true;
    local_6a8._9_7_ = 0;
    local_6a8._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection3.GetWaste()";
    in_stack_fffffffffffff200 = &local_6a8;
    in_stack_fffffffffffff1f8 = "fee_diff * -2 + change_cost";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_688,local_698,0x38f,1,2,&local_6a8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_708._8_8_ = SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    local_708._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection1.GetWaste()";
    in_stack_fffffffffffff200 = &local_708;
    in_stack_fffffffffffff1f8 = "selection3.GetWaste()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,long,long>
              (local_6e8,local_6f8,0x390,1,4,&local_708.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_710 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_718 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_778.m_empty = true;
    local_778._9_7_ = 0;
    local_778._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection_nochange1.GetWaste()";
    in_stack_fffffffffffff200 = &local_778;
    in_stack_fffffffffffff1f8 = "fee_diff * 2 + excess";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_758,local_768,0x399,1,2,&local_778.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_780 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_788 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,in_stack_fffffffffffff330,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_7e8.m_empty = false;
    local_7e8._9_7_ = 0;
    local_7e8._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection_nochange2.GetWaste()";
    in_stack_fffffffffffff200 = &local_7e8;
    in_stack_fffffffffffff1f8 = "fee_diff * -2 + excess";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_7c8,local_7d8,0x3a1,1,2,&local_7e8.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_848._8_8_ = SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    local_848._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection_nochange1.GetWaste()";
    in_stack_fffffffffffff200 = &local_848;
    in_stack_fffffffffffff1f8 = "selection_nochange2.GetWaste()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,long,long>
              (local_828,local_838,0x3a2,1,4,&local_848.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  fee_00 = local_2a8;
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_850 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_858 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_8b0._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection.GetWaste()";
    in_stack_fffffffffffff200 = &local_8b0;
    in_stack_fffffffffffff1f8 = "change_cost";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_898,&local_8b0.m_empty,0x3ab,1,2,&local_550);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_8b8 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_8c0 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_918._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection.GetWaste()";
    in_stack_fffffffffffff200 = &local_918;
    in_stack_fffffffffffff1f8 = "excess";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_900,&local_918.m_empty,0x3b4,1,2,&local_558);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_920 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_928 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_988._12_4_ = 0;
    local_988._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection.GetWaste()";
    in_stack_fffffffffffff200 = &local_988;
    in_stack_fffffffffffff1f8 = "0";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (local_968,local_978,0x3bd,1,2,&local_988.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_990 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_998 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_9f8._12_4_ = 0;
    local_9f8._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection.GetWaste()";
    in_stack_fffffffffffff200 = &local_9f8;
    in_stack_fffffffffffff1f8 = "0";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (local_9d8,local_9e8,0x3c6,1,2,&local_9f8.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_a00 = 100000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_a08 = 200000000;
  add_coin(in_stack_fffffffffffff260,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
           in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    local_a68._12_4_ = 0;
    local_a68._vptr_lazy_ostream =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection.GetWaste()";
    in_stack_fffffffffffff200 = &local_a68;
    in_stack_fffffffffffff1f8 = "0";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
              (local_a48,local_a58,0x3d0,1,2,&local_a68.field_0xc);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    iVar5 = (int)((ulong)in_stack_fffffffffffff258 >> 0x20);
  } while (bVar1);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_a70 = 0xffffffffffffffb0;
  local_a78 = 100000000;
  add_coin(in_stack_fffffffffffff260,iVar5,in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  local_a80 = 200000000;
  add_coin(in_stack_fffffffffffff260,iVar5,in_stack_fffffffffffff250,(CAmount)fee_00,
           CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  SelectionResult::RecalculateWaste
            (in_stack_fffffffffffff240,(CAmount)in_stack_fffffffffffff238,
             (CAmount)in_stack_fffffffffffff230,(CAmount)in_stack_fffffffffffff228);
  do {
    puVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff238,(const_string *)in_stack_fffffffffffff230,
               (size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    iVar5 = (int)((ulong)plVar3 >> 0x20);
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    result = (SelectionResult *)
             SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection.GetWaste()";
    in_stack_fffffffffffff200 = &local_ad8;
    in_stack_fffffffffffff1f8 = "target_waste1";
    local_ad8._vptr_lazy_ostream = (_func_int **)result;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_ac0,&local_ad8.m_empty,0x3da,1,2,&local_a70);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  this_00 = local_548;
  SelectionResult::SelectionResult
            ((SelectionResult *)in_stack_fffffffffffff208,(CAmount)in_stack_fffffffffffff200,
             (SelectionAlgorithm)((ulong)in_stack_fffffffffffff1f8 >> 0x38));
  local_ae0 = 0xffffffffffffffc9;
  local_ae8 = 100000000;
  add_coin((CAmount *)puVar4,iVar5,result,(CAmount)fee_00,CONCAT17(uVar2,in_stack_fffffffffffff248))
  ;
  local_af0 = 200000000;
  add_coin((CAmount *)puVar4,iVar5,result,(CAmount)fee_00,CONCAT17(uVar2,in_stack_fffffffffffff248))
  ;
  SelectionResult::RecalculateWaste
            (this_00,(CAmount)in_stack_fffffffffffff238,(CAmount)in_stack_fffffffffffff230,
             (CAmount)in_stack_fffffffffffff228);
  do {
    puVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (puVar4,(const_string *)in_stack_fffffffffffff230,(size_t)in_stack_fffffffffffff228,
               (const_string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    in_stack_fffffffffffff230 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff200,(char (*) [1])in_stack_fffffffffffff1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff208,
               (pointer)in_stack_fffffffffffff200,(unsigned_long)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff228 =
         (_func_int **)SelectionResult::GetWaste((SelectionResult *)in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff208 = "selection.GetWaste()";
    in_stack_fffffffffffff200 = &local_b48;
    in_stack_fffffffffffff1f8 = "target_waste2";
    local_b48._vptr_lazy_ostream = in_stack_fffffffffffff228;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_b30,&local_b48.m_empty,0x3e9,1,2,&local_ae0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff227 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff227);
  SelectionResult::~SelectionResult((SelectionResult *)in_stack_fffffffffffff1f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(waste_test)
{
    const CAmount fee{100};
    const CAmount min_viable_change{300};
    const CAmount change_cost{125};
    const CAmount change_fee{30};
    const CAmount fee_diff{40};
    const CAmount in_amt{3 * COIN};
    const CAmount target{2 * COIN};
    const CAmount excess{80};
    const CAmount exact_target{in_amt - fee * 2}; // Maximum spendable amount after fees: no change, no excess

    // In the following, we test that the waste is calculated correctly in various scenarios.
    // Usually, RecalculateWaste would compute change_fee and change_cost on basis of the
    // change output type, current feerate, and discard_feerate, but we use fixed values
    // across this test to make the test easier to understand.
    {
        // Waste with change is the change cost and difference between fee and long term fee
        SelectionResult selection1{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection1, /*fee=*/fee, /*long_term_fee=*/fee - fee_diff);
        add_coin(2 * COIN, 2, selection1, fee, fee - fee_diff);
        selection1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + change_cost, selection1.GetWaste());

        // Waste will be greater when fee is greater, but long term fee is the same
        SelectionResult selection2{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection2, fee * 2, fee - fee_diff);
        add_coin(2 * COIN, 2, selection2, fee * 2, fee - fee_diff);
        selection2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_GT(selection2.GetWaste(), selection1.GetWaste());

        // Waste with change is the change cost and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection3{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection3, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection3, fee, fee + fee_diff);
        selection3.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + change_cost, selection3.GetWaste());
        BOOST_CHECK_LT(selection3.GetWaste(), selection1.GetWaste());
    }

    {
        // Waste without change is the excess and difference between fee and long term fee
        SelectionResult selection_nochange1{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange1, fee, fee - fee_diff);
        add_coin(2 * COIN, 2, selection_nochange1, fee, fee - fee_diff);
        selection_nochange1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + excess, selection_nochange1.GetWaste());

        // Waste without change is the excess and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection_nochange2{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange2, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection_nochange2, fee, fee + fee_diff);
        selection_nochange2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + excess, selection_nochange2.GetWaste());
        BOOST_CHECK_LT(selection_nochange2.GetWaste(), selection_nochange1.GetWaste());
    }

    {
        // Waste with change and fee == long term fee is just cost of change
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(change_cost, selection.GetWaste());
    }

    {
        // Waste without change and fee == long term fee is just the excess
        SelectionResult selection{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(excess, selection.GetWaste());
    }

    {
        // Waste is 0 when fee == long_term_fee, no change, and no excess
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost , change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-cost_of_change), and no excess
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, /*change_cost=*/fee_diff * 2, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-excess), no change cost
        const CAmount new_target{exact_target - /*excess=*/fee_diff * 2};
        SelectionResult selection{new_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and the selected value == target
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        const CAmount target_waste1{-2 * fee_diff}; // = (2 * fee) - (2 * (fee + fee_diff))
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste1, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and change_cost < - (inputs * (fee - long_term_fee))
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        const CAmount large_fee_diff{90};
        const CAmount target_waste2{-2 * large_fee_diff + change_cost};
        // = (2 * fee) - (2 * (fee + large_fee_diff)) + change_cost
        // = (2 * 100) - (2 * (100 + 90)) + 125
        // = 200 - 380 + 125 = -55
        assert(target_waste2 == -55);
        add_coin(1 * COIN, 1, selection, fee, fee + large_fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + large_fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste2, selection.GetWaste());
    }
}